

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstantDelta
               (int constant,int frame_of_reference,idx_t count,int *values,bool *validity,
               void *data_ptr)

{
  int *piVar1;
  
  ReserveSpace((BitpackingCompressionState<int,_true,_int> *)data_ptr,8);
  WriteMetaData((BitpackingCompressionState<int,_true,_int> *)data_ptr,CONSTANT_DELTA);
  piVar1 = *(int **)((long)data_ptr + 0x40);
  *piVar1 = frame_of_reference;
  piVar1[1] = constant;
  *(int **)((long)data_ptr + 0x40) = piVar1 + 2;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}